

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

size_t hd_available(hd_context *ctx,hd_stream *stm,size_t max)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  int local_34;
  int c;
  size_t len;
  size_t max_local;
  hd_stream *stm_local;
  hd_context *ctx_local;
  
  ctx_local = (hd_context *)(stm->wp + -(long)stm->rp);
  local_34 = -1;
  if (ctx_local == (hd_context *)0x0) {
    iVar2 = hd_push_try(ctx);
    if ((iVar2 != 0) && (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 == 0)) {
      local_34 = (*stm->next)(ctx,stm,max);
    }
    phVar1 = ctx->error->top;
    ctx->error->top = phVar1 + -1;
    if (1 < phVar1->code) {
      hd_rethrow_if(ctx,4);
      hd_warn(ctx,"read error; treating as end of file");
      stm->error = 1;
      local_34 = -1;
    }
    if (local_34 == -1) {
      stm->eof = 1;
      ctx_local = (hd_context *)0x0;
    }
    else {
      stm->rp = stm->rp + -1;
      ctx_local = (hd_context *)(stm->wp + -(long)stm->rp);
    }
  }
  return (size_t)ctx_local;
}

Assistant:

static inline size_t hd_available(hd_context *ctx, hd_stream *stm, size_t max)
{
    size_t len = stm->wp - stm->rp;
    int c = EOF;

    if (len)
        return len;
    hd_try(ctx)
    {
        c = stm->next(ctx, stm, max);
    }
    hd_catch(ctx)
    {
        hd_rethrow_if(ctx, HD_ERROR_TRYLATER);
        hd_warn(ctx, "read error; treating as end of file");
        stm->error = 1;
        c = EOF;
    }
    if (c == EOF)
    {
        stm->eof = 1;
        return 0;
    }
    stm->rp--;
    return stm->wp - stm->rp;
}